

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *node)

{
  undefined1 *puVar1;
  int *piVar2;
  float fVar3;
  ImGuiAxis axis;
  ImGuiDockNode *node_00;
  ImGuiDockNode *node_01;
  ImDrawList *this;
  ImGuiDockNode *pIVar4;
  long lVar5;
  void *pvVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiContext *pIVar11;
  bool bVar12;
  uint uVar13;
  ImU32 col;
  ImGuiID IVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float cur_size_1;
  float cur_size_0;
  ImRect bb;
  ImVector<ImGuiDockNode_*> touching_nodes [2];
  float local_a4;
  float local_a0;
  float local_9c;
  ImRect local_98;
  float local_84;
  float local_80;
  ImU32 local_7c;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  ImVector<ImGuiDockNode_*> local_68;
  undefined1 local_58 [16];
  ImVec2 local_48;
  float afStack_40 [4];
  
  pIVar11 = GImGui;
  node_00 = node->ChildNodes[0];
  if (node_00 != (ImGuiDockNode *)0x0) {
    node_01 = node->ChildNodes[1];
    if (((node_00->field_0xc5 & 2) != 0) && ((node_01->field_0xc5 & 2) != 0)) {
      axis = node->SplitAxis;
      lVar17 = (long)axis;
      if (lVar17 == -1) {
        __assert_fail("axis != ImGuiAxis_None",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                      ,0x3edd,"void ImGui::DockNodeTreeUpdateSplitter(ImGuiDockNode *)");
      }
      local_98.Min = node_00->Pos;
      local_98.Max = node_01->Pos;
      if (1 < (uint)axis) {
        __assert_fail("idx <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.h"
                      ,0x105,"float &ImVec2::operator[](size_t)");
      }
      (&local_98.Min.x)[lVar17] =
           *(float *)((long)node_00->ChildNodes + lVar17 * 4 + 0x30) + (&local_98.Min.x)[lVar17];
      uVar15 = (ulong)(uint)axis ^ 1;
      (&local_98.Max.x)[uVar15] =
           *(float *)((long)node_01->ChildNodes + uVar15 * 4 + 0x30) + (&local_98.Max.x)[uVar15];
      uVar13 = node_01->MergedFlags | node_00->MergedFlags;
      if (((uVar13 & 0x20) == 0) &&
         ((uVar13 & (uint)((ulong)(uint)axis != 0) * 0x400000 + 0x400000) == 0)) {
        PushID(node->ID);
        local_68.Size = 0;
        local_68.Capacity = 0;
        local_68.Data = (ImGuiDockNode **)0x0;
        local_78._0_4_ = 0.0;
        local_78._4_4_ = 0.0;
        uStack_70 = (ImGuiDockNode **)0x0;
        fVar3 = (&(pIVar11->Style).WindowMinSize.x)[lVar17];
        local_58 = ZEXT416((uint)(*(float *)((long)node->ChildNodes[0]->ChildNodes +
                                            lVar17 * 4 + 0x28) + fVar3));
        fVar19 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar17 * 4 + 0x28);
        fVar18 = *(float *)((long)node->ChildNodes[1]->ChildNodes + lVar17 * 4 + 0x30);
        IVar14 = ImGuiWindow::GetID(GImGui->CurrentWindow,"##Splitter",(char *)0x0);
        local_a4 = (fVar19 + fVar18) - fVar3;
        if (pIVar11->ActiveId == IVar14) {
          DockNodeTreeUpdateSplitterFindTouchingNode
                    (node_00,axis,1,(ImVector<ImGuiDockNode_*> *)local_78);
          DockNodeTreeUpdateSplitterFindTouchingNode(node_01,axis,0,&local_68);
          if (0 < (long)(int)local_78._0_4_) {
            lVar16 = 0;
            fVar19 = (float)local_58._0_4_;
            do {
              pIVar4 = uStack_70[lVar16];
              local_48 = pIVar4->Pos;
              afStack_40[1] = (pIVar4->Pos).y + (pIVar4->Size).y;
              afStack_40[0] = (pIVar4->Pos).x + (pIVar4->Size).x;
              fVar18 = (&local_48.x)[lVar17] + fVar3;
              uVar13 = -(uint)(fVar18 <= fVar19);
              fVar19 = (float)(uVar13 & (uint)fVar19 | ~uVar13 & (uint)fVar18);
              local_58 = ZEXT416((uint)fVar19);
              lVar16 = lVar16 + 1;
            } while ((int)local_78._0_4_ != lVar16);
          }
          if (0 < (long)local_68.Size) {
            lVar16 = 0;
            do {
              pIVar4 = local_68.Data[lVar16];
              local_48 = pIVar4->Pos;
              afStack_40[1] = (pIVar4->Pos).y + (pIVar4->Size).y;
              afStack_40[0] = (pIVar4->Pos).x + (pIVar4->Size).x;
              if (afStack_40[lVar17] - fVar3 <= local_a4) {
                local_a4 = afStack_40[lVar17] - fVar3;
              }
              lVar16 = lVar16 + 1;
            } while (local_68.Size != lVar16);
          }
        }
        pIVar11 = GImGui;
        local_9c = *(float *)((long)node_00->ChildNodes + lVar17 * 4 + 0x30);
        local_a0 = *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x30);
        local_80 = *(float *)((long)node_00->ChildNodes + lVar17 * 4 + 0x28);
        fVar3 = *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x28);
        local_84 = *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x30);
        local_48 = *(ImVec2 *)((GImGui->Style).Colors + 2);
        uVar9 = (GImGui->Style).Colors[2].z;
        uVar10 = (GImGui->Style).Colors[2].w;
        afStack_40[1] = (GImGui->Style).Alpha * (float)uVar10;
        afStack_40[0] = (float)uVar9;
        local_7c = ColorConvertFloat4ToU32((ImVec4 *)&local_48);
        IVar14 = ImGuiWindow::GetID(pIVar11->CurrentWindow,"##Splitter",(char *)0x0);
        bVar12 = SplitterBehavior(&local_98,IVar14,axis,&local_9c,&local_a0,
                                  (float)local_58._0_4_ - local_80,(fVar3 + local_84) - local_a4,4.0
                                  ,0.04,local_7c);
        if (((bVar12) && (0 < (int)local_78._0_4_)) && (0 < local_68.Size)) {
          *(float *)((long)node_00->ChildNodes + lVar17 * 4 + 0x38) = local_9c;
          *(float *)((long)node_00->ChildNodes + lVar17 * 4 + 0x30) = local_9c;
          *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x28) =
               *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x28) -
               (local_a0 - *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x30));
          *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x38) = local_a0;
          *(float *)((long)node_01->ChildNodes + lVar17 * 4 + 0x30) = local_a0;
          lVar17 = 0;
          do {
            if (0 < *(int *)(local_78 + lVar17 * 0x10)) {
              lVar16 = 0;
              do {
                lVar5 = *(long *)((&uStack_70)[lVar17 * 2] + lVar16 * 8);
                pIVar4 = *(ImGuiDockNode **)(lVar5 + 0x18);
                while (pIVar4 != node) {
                  if (pIVar4->SplitAxis == axis) {
                    puVar1 = &pIVar4->ChildNodes[lVar17]->field_0xc6;
                    *puVar1 = *puVar1 | 1;
                  }
                  lVar5 = *(long *)(lVar5 + 0x18);
                  pIVar4 = *(ImGuiDockNode **)(lVar5 + 0x18);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < *(int *)(local_78 + lVar17 * 0x10));
            }
            bVar12 = lVar17 == 0;
            lVar17 = lVar17 + 1;
          } while (bVar12);
          DockNodeTreeUpdatePosSize(node_00,node_00->Pos,node_00->Size,(ImGuiDockNode *)0x0);
          DockNodeTreeUpdatePosSize(node_01,node_01->Pos,node_01->Size,(ImGuiDockNode *)0x0);
          if (GImGui->SettingsDirtyTimer <= 0.0) {
            GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
          }
        }
        PopID();
        lVar17 = 0x20;
        do {
          pvVar6 = *(void **)((long)&local_80 + lVar17);
          if (pvVar6 != (void *)0x0) {
            if (GImGui != (ImGuiContext *)0x0) {
              piVar2 = &(GImGui->IO).MetricsActiveAllocations;
              *piVar2 = *piVar2 + -1;
            }
            (*GImAllocatorFreeFunc)(pvVar6,GImAllocatorUserData);
          }
          lVar17 = lVar17 + -0x10;
        } while (lVar17 != 0);
      }
      else {
        this = GImGui->CurrentWindow->DrawList;
        local_78._0_4_ = (GImGui->Style).Colors[0x1b].x;
        local_78._4_4_ = (GImGui->Style).Colors[0x1b].y;
        uVar7 = (GImGui->Style).Colors[0x1b].z;
        uVar8 = (GImGui->Style).Colors[0x1b].w;
        uStack_70 = (ImGuiDockNode **)CONCAT44((GImGui->Style).Alpha * (float)uVar8,uVar7);
        col = ColorConvertFloat4ToU32((ImVec4 *)local_78);
        ImDrawList::AddRectFilled
                  (this,&local_98.Min,&local_98.Max,col,(pIVar11->Style).FrameRounding,0);
      }
    }
    if ((node_00->field_0xc5 & 2) != 0) {
      DockNodeTreeUpdateSplitter(node_00);
    }
    if ((node_01->field_0xc5 & 2) != 0) {
      DockNodeTreeUpdateSplitter(node_01);
    }
  }
  return;
}

Assistant:

void ImTriangleBarycentricCoords(const ImVec2& a, const ImVec2& b, const ImVec2& c, const ImVec2& p, float& out_u, float& out_v, float& out_w)
{
    ImVec2 v0 = b - a;
    ImVec2 v1 = c - a;
    ImVec2 v2 = p - a;
    const float denom = v0.x * v1.y - v1.x * v0.y;
    out_v = (v2.x * v1.y - v1.x * v2.y) / denom;
    out_w = (v0.x * v2.y - v2.x * v0.y) / denom;
    out_u = 1.0f - out_v - out_w;
}